

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
header_inclusion_csv_actions::header(header_inclusion_csv_actions *this,string *header)

{
  char local_9;
  
  if (this->first_header == true) {
    this->first_header = false;
  }
  else {
    local_9 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(header->_M_dataplus)._M_p,header->_M_string_length);
  return;
}

Assistant:

void header( std::string const & header )
    {
        if( first_header )
        {
            first_header = false;
        }
        else
        {
            std::cout << ' ';
        }
       
        std::cout << header;
    }